

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

bool __thiscall
pktalloc::LightVector<SiameseOriginalPacket,_25U>::SetSize_NoCopy
          (LightVector<SiameseOriginalPacket,_25U> *this,uint elements)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  uint in_ESI;
  void *in_RDI;
  SiameseOriginalPacket *oldData;
  SiameseOriginalPacket *newData;
  uint newAllocated;
  void *local_50;
  
  if (*(uint *)((long)in_RDI + 0x1a0) < in_ESI) {
    uVar2 = in_ESI * 3 >> 1;
    auVar1 = ZEXT416(uVar2) * ZEXT816(0x10);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    local_50 = (void *)0x0;
    if (pvVar4 != (void *)0x0) {
      local_50 = pvVar4;
    }
    if (local_50 == (void *)0x0) {
      return false;
    }
    pvVar4 = *(void **)((long)in_RDI + 0x198);
    *(uint *)((long)in_RDI + 0x1a0) = uVar2;
    *(void **)((long)in_RDI + 0x198) = local_50;
    if ((pvVar4 != in_RDI) && (pvVar4 != (void *)0x0)) {
      operator_delete__(pvVar4);
    }
  }
  *(uint *)((long)in_RDI + 400) = in_ESI;
  return true;
}

Assistant:

bool SetSize_NoCopy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData)
                return false;
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Delete old data without copying
            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }